

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntercomCommunicationParameters.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::IntercomCommunicationParameters::SetRecord
          (IntercomCommunicationParameters *this,GroupAssignmentRecord *GAR)

{
  GroupAssignmentRecord *GAR_local;
  IntercomCommunicationParameters *this_local;
  
  if (GAR != (GroupAssignmentRecord *)0x0) {
    if (((this->m_pRecord != (DataTypeBase *)0x0) && ((this->m_bMemoryManage & 1U) != 0)) &&
       (this->m_pRecord != (DataTypeBase *)0x0)) {
      (*this->m_pRecord->_vptr_DataTypeBase[1])();
    }
    this->m_bMemoryManage = false;
    this->m_ui16Length = 0x10;
    this->m_ui16Type = 3;
    this->m_pRecord = &GAR->super_DataTypeBase;
  }
  return;
}

Assistant:

void IntercomCommunicationParameters::SetRecord( GroupAssignmentRecord * GAR )
{
    if( !GAR )return;

    if( m_pRecord && m_bMemoryManage )delete m_pRecord;

    m_bMemoryManage = false;

    m_ui16Length = GroupAssignmentRecord::GROUP_ASSIGNMENT_RECORD_SIZE;

    m_ui16Type = GroupAssignmentRecord_Type;

    m_pRecord = GAR;
}